

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel_p.h
# Opt level: O2

void __thiscall
QFileSystemModelPrivate::QFileSystemNode::updateIcon
          (QFileSystemNode *this,QAbstractFileIconProvider *iconProvider,QString *path)

{
  Span *pSVar1;
  QFileSystemNode *this_00;
  char cVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_78;
  piter local_60;
  undefined1 local_50 [16];
  QFileSystemNode *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (iconProvider != (QAbstractFileIconProvider *)0x0) {
    if (this->info != (QExtendedInformation *)0x0) {
      QFileInfo::QFileInfo((QFileInfo *)local_50,(QString *)path);
      (*iconProvider->_vptr_QAbstractFileIconProvider[3])
                (&QStack_78,iconProvider,(QFileInfo *)local_50);
      QIcon::operator=(&this->info->icon,(QIcon *)&QStack_78);
      QIcon::~QIcon((QIcon *)&QStack_78);
      QFileInfo::~QFileInfo((QFileInfo *)local_50);
    }
    local_60 = (piter)QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*>::begin
                                (&this->children);
    while( true ) {
      if (local_60.d ==
          (Data<QHashPrivate::Node<QString,_QFileSystemModelPrivate::QFileSystemNode_*>_> *)0x0 &&
          local_60.bucket == 0) break;
      pSVar1 = (local_60.d)->spans;
      uVar3 = local_60.bucket >> 7;
      this_00 = *(QFileSystemNode **)
                 (pSVar1[uVar3].entries[pSVar1[uVar3].offsets[(uint)local_60.bucket & 0x7f]].storage
                  .data + 0x18);
      if ((path->d).size == 0) {
        updateIcon(this_00,iconProvider,&this_00->fileName);
      }
      else {
        cVar2 = QString::endsWith((QChar)(char16_t)path,0x2f);
        local_50._0_8_ = path;
        if (cVar2 == '\0') {
          local_50._8_2_ = 0x2f;
          local_40 = this_00;
          QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_QString_&>::convertTo<QString>
                    ((QString *)&QStack_78,
                     (QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_QString_&> *)
                     local_50);
        }
        else {
          local_50._8_8_ = this_00;
          QStringBuilder<const_QString_&,_QString_&>::convertTo<QString>
                    ((QString *)&QStack_78,(QStringBuilder<const_QString_&,_QString_&> *)local_50);
        }
        updateIcon(this_00,iconProvider,(QString *)&QStack_78);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_78);
      }
      QHashPrivate::
      iterator<QHashPrivate::Node<QString,_QFileSystemModelPrivate::QFileSystemNode_*>_>::operator++
                (&local_60);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void updateIcon(QAbstractFileIconProvider *iconProvider, const QString &path) {
            if (!iconProvider)
                return;

            if (info)
                info->icon = iconProvider->icon(QFileInfo(path));

            for (QFileSystemNode *child : std::as_const(children)) {
                //On windows the root (My computer) has no path so we don't want to add a / for nothing (e.g. /C:/)
                if (!path.isEmpty()) {
                    if (path.endsWith(u'/'))
                        child->updateIcon(iconProvider, path + child->fileName);
                    else
                        child->updateIcon(iconProvider, path + u'/' + child->fileName);
                } else
                    child->updateIcon(iconProvider, child->fileName);
            }
        }